

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

void rgbcx::compute_least_squares_endpoints3_rgb
               (vec3F *pXl,vec3F *pXh,int total_r,int total_g,int total_b,float iz00,float iz10,
               float iz11,uint32_t s,uint32_t *r_sum,uint32_t *g_sum,uint32_t *b_sum)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float q10_b;
  float q10_g;
  float q10_r;
  uint32_t uq00_b;
  uint32_t uq00_g;
  uint32_t uq00_r;
  uint32_t f2;
  uint32_t f1;
  float iz01;
  uint32_t s_local;
  float iz11_local;
  float iz10_local;
  float iz00_local;
  int total_b_local;
  int total_g_local;
  int total_r_local;
  vec3F *pXh_local;
  vec3F *pXl_local;
  
  uVar3 = (uint)(byte)g_unique_total_orders3[(ulong)s * 3];
  uVar4 = (uint)(byte)g_unique_total_orders3[(ulong)s * 3] +
          (uint)(byte)g_unique_total_orders3[(ulong)s * 3 + 2];
  uVar1 = (-r_sum[uVar4] - r_sum[uVar3]) + r_sum[0x10] * 2;
  uVar2 = (-g_sum[uVar4] - g_sum[uVar3]) + g_sum[0x10] * 2;
  uVar3 = (-b_sum[uVar4] - b_sum[uVar3]) + b_sum[0x10] * 2;
  fVar5 = (float)(total_r * 2 - uVar1);
  fVar6 = (float)(total_g * 2 - uVar2);
  fVar7 = (float)(total_b * 2 - uVar3);
  pXl->c[0] = iz00 * (float)uVar1 + iz10 * fVar5;
  pXh->c[0] = iz10 * (float)uVar1 + iz11 * fVar5;
  pXl->c[1] = iz00 * (float)uVar2 + iz10 * fVar6;
  pXh->c[1] = iz10 * (float)uVar2 + iz11 * fVar6;
  pXl->c[2] = iz00 * (float)uVar3 + iz10 * fVar7;
  pXh->c[2] = iz10 * (float)uVar3 + iz11 * fVar7;
  return;
}

Assistant:

static inline void compute_least_squares_endpoints3_rgb(
		vec3F* pXl, vec3F* pXh,
		int total_r, int total_g, int total_b,
		float iz00, float iz10, float iz11,
		uint32_t s, const uint32_t r_sum[17], const uint32_t g_sum[17], const uint32_t b_sum[17])
	{
		const float iz01 = iz10;

		// Compensates for BC1 3-color ordering, which is selector 0, 2, 1
		const uint32_t f1 = g_unique_total_orders3[s][0];
		const uint32_t f2 = g_unique_total_orders3[s][0] + g_unique_total_orders3[s][2];
		uint32_t uq00_r = (r_sum[16] - r_sum[f2]) * 2 + (r_sum[f2] - r_sum[f1]);
		uint32_t uq00_g = (g_sum[16] - g_sum[f2]) * 2 + (g_sum[f2] - g_sum[f1]);
		uint32_t uq00_b = (b_sum[16] - b_sum[f2]) * 2 + (b_sum[f2] - b_sum[f1]);

		float q10_r = (float)(total_r * 2 - uq00_r);
		float q10_g = (float)(total_g * 2 - uq00_g);
		float q10_b = (float)(total_b * 2 - uq00_b);

		pXl->c[0] = iz00 * (float)uq00_r + iz01 * q10_r;
		pXh->c[0] = iz10 * (float)uq00_r + iz11 * q10_r;

		pXl->c[1] = iz00 * (float)uq00_g + iz01 * q10_g;
		pXh->c[1] = iz10 * (float)uq00_g + iz11 * q10_g;

		pXl->c[2] = iz00 * (float)uq00_b + iz01 * q10_b;
		pXh->c[2] = iz10 * (float)uq00_b + iz11 * q10_b;
	}